

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Collision_Elastic_PDU.cpp
# Opt level: O1

void __thiscall
KDIS::PDU::Collision_Elastic_PDU::Collision_Elastic_PDU
          (Collision_Elastic_PDU *this,KDataStream *stream)

{
  Header7::Header7(&this->super_Header);
  (this->super_Header).super_Header6._vptr_Header6 =
       (_func_int **)&PTR__Collision_Elastic_PDU_002227a0;
  DATA_TYPE::EntityIdentifier::EntityIdentifier(&this->m_IssuingEntityID);
  DATA_TYPE::EntityIdentifier::EntityIdentifier(&this->m_CollidingEntityID);
  DATA_TYPE::EntityIdentifier::EntityIdentifier(&this->m_EventID);
  DATA_TYPE::Vector::Vector(&this->m_ContactVelocity);
  DATA_TYPE::Vector::Vector(&this->m_Location);
  DATA_TYPE::Vector::Vector(&this->m_UnitSurfaceNormal);
  (*(this->super_Header).super_Header6._vptr_Header6[3])(this,stream,0);
  return;
}

Assistant:

Collision_Elastic_PDU::Collision_Elastic_PDU(KDataStream &stream) noexcept(false)
{
    Decode( stream, false );
}